

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_706387::RSATest_BlindingDisabled_Test::~RSATest_BlindingDisabled_Test
          (RSATest_BlindingDisabled_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(RSATest, BlindingDisabled) {
  bssl::UniquePtr<RSA> rsa(RSA_private_key_from_bytes(kKey2, sizeof(kKey2)));
  ASSERT_TRUE(rsa);

  rsa->flags |= RSA_FLAG_NO_BLINDING;

  std::vector<uint8_t> sig(RSA_size(rsa.get()));
  static const uint8_t kZeros[32] = {0};
  unsigned sig_len;
  ASSERT_TRUE(RSA_sign(NID_sha256, kZeros, sizeof(kZeros), sig.data(), &sig_len,
                       rsa.get()));
  EXPECT_TRUE(RSA_verify(NID_sha256, kZeros, sizeof(kZeros), sig.data(),
                         sig_len, rsa.get()));
}